

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O3

void gimage::gauss<float>
               (Image<float,_gimage::PixelTraits<float>_> *target,
               Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  float ***pppfVar5;
  float *pfVar6;
  long lVar7;
  long i;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  GaussKernel kernel;
  ImageFloat tmp;
  GaussKernel local_c8;
  float *local_b8;
  long local_b0;
  float ***local_a8;
  Image<float,_gimage::PixelTraits<float>_> *local_a0;
  long local_98;
  float *local_90;
  Image<float,_gimage::PixelTraits<float>_> *local_88;
  float ***local_80;
  long local_78;
  float **local_70;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_c8.kernel = (float *)0x0;
  local_c8.kn = 0;
  local_c8.kn2 = 0;
  GaussKernel::set(&local_c8,s);
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_68,image->height,1,1);
  pfVar1 = **local_68.img;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (target,image->width,image->height,(long)image->depth);
  local_78 = (long)image->depth;
  if (0 < local_78) {
    local_80 = target->img;
    lVar2 = image->width;
    local_98 = image->height;
    lVar7 = 0;
    do {
      local_70 = local_80[lVar7];
      pfVar6 = *local_70;
      if (0 < local_98) {
        local_b0 = -(ulong)(uint)local_c8.kn2;
        lVar11 = 0;
        pfVar3 = pfVar6;
        do {
          if (0 < lVar2) {
            local_a8 = image->img;
            lVar8 = 0;
            lVar4 = local_b0;
            do {
              if (lVar8 < lVar2 - local_c8.kn2 && local_c8.kn2 <= lVar8) {
                if (local_c8.kn < 1) {
                  fVar14 = 0.0;
                }
                else {
                  fVar14 = 0.0;
                  lVar9 = 0;
                  do {
                    fVar14 = fVar14 + local_c8.kernel[lVar9] *
                                      local_a8[lVar7][lVar11][(int)lVar4 + lVar9];
                    lVar9 = lVar9 + 1;
                  } while (local_c8.kn != lVar9);
                }
              }
              else {
                fVar14 = NAN;
                if (0 < local_c8.kn) {
                  fVar15 = 0.0;
                  lVar9 = 0;
                  fVar14 = 0.0;
                  do {
                    uVar12 = (int)lVar4 + (int)lVar9;
                    if ((-1 < (int)uVar12) &&
                       (uVar13 = (ulong)(uVar12 & 0x7fffffff), (long)uVar13 < lVar2)) {
                      fVar15 = fVar15 + local_c8.kernel[lVar9];
                      fVar14 = fVar14 + local_c8.kernel[lVar9] * image->img[lVar7][lVar11][uVar13];
                    }
                    lVar9 = lVar9 + 1;
                  } while (local_c8.kn != lVar9);
                  fVar14 = fVar14 / fVar15;
                }
              }
              *pfVar3 = fVar14;
              pfVar3 = pfVar3 + 1;
              lVar8 = lVar8 + 1;
              lVar4 = lVar4 + 1;
            } while (lVar8 != lVar2);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_98);
      }
      local_b8 = pfVar6;
      if (0 < lVar2) {
        lVar11 = target->width;
        local_a8 = (float ***)-(ulong)(uint)local_c8.kn2;
        local_b0 = lVar11 * 4;
        lVar4 = 0;
        do {
          if (0 < local_98) {
            lVar8 = target->height;
            lVar9 = 0;
            pppfVar5 = local_a8;
            do {
              if ((lVar9 < local_c8.kn2) || (lVar8 - local_c8.kn2 <= lVar9)) {
                fVar14 = NAN;
                if (0 < local_c8.kn) {
                  fVar15 = 0.0;
                  lVar10 = 0;
                  fVar14 = 0.0;
                  do {
                    uVar12 = (int)pppfVar5 + (int)lVar10;
                    if ((-1 < (int)uVar12) &&
                       (uVar13 = (ulong)(uVar12 & 0x7fffffff), (long)uVar13 < target->height)) {
                      fVar15 = fVar15 + local_c8.kernel[lVar10];
                      fVar14 = fVar14 + local_c8.kernel[lVar10] * target->img[lVar7][uVar13][lVar4];
                    }
                    lVar10 = lVar10 + 1;
                  } while (local_c8.kn != lVar10);
                  fVar14 = fVar14 / fVar15;
                }
              }
              else if (local_c8.kn < 1) {
                fVar14 = 0.0;
              }
              else {
                fVar14 = 0.0;
                lVar10 = 0;
                do {
                  fVar14 = fVar14 + local_c8.kernel[lVar10] *
                                    local_70[(int)pppfVar5 + lVar10][lVar4];
                  lVar10 = lVar10 + 1;
                } while (local_c8.kn != lVar10);
              }
              pfVar1[lVar9] = fVar14;
              lVar9 = lVar9 + 1;
              pppfVar5 = (float ***)((long)pppfVar5 + 1);
            } while (lVar9 != local_98);
            local_b8 = pfVar6;
            if (0 < local_98) {
              lVar8 = 0;
              pfVar3 = pfVar6;
              do {
                *pfVar3 = pfVar1[lVar8];
                lVar8 = lVar8 + 1;
                pfVar3 = pfVar3 + lVar11;
              } while (local_98 != lVar8);
            }
          }
          lVar4 = lVar4 + 1;
          pfVar6 = pfVar6 + 1;
        } while (lVar4 != lVar2);
      }
      lVar7 = lVar7 + 1;
      local_90 = pfVar1;
      local_88 = target;
    } while (lVar7 != local_78);
  }
  local_a0 = image;
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  if (local_c8.kernel != (float *)0x0) {
    operator_delete__(local_c8.kernel);
  }
  return;
}

Assistant:

void gauss(Image<T> &target, const Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(image.getHeight(), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  target.setSize(image.getWidth(), image.getHeight(), image.getDepth());

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal into target image

    T *tp=target.getPtr(0, 0, d);
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(kernel.convolveHorizontal(image, i, k, d));
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(target, i, k, d);
      }

      tp=target.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=target.getWidth();
      }
    }
  }
}